

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gmock-matchers.cc
# Opt level: O2

bool __thiscall
testing::internal::UnorderedElementsAreMatcherImplBase::VerifyMatchMatrix
          (UnorderedElementsAreMatcherImplBase *this,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *element_printouts,MatchMatrix *matrix,MatchResultListener *listener)

{
  byte *pbVar1;
  size_type __n;
  long *plVar2;
  uint uVar3;
  size_t irhs;
  ulong uVar4;
  MatchResultListener *pMVar5;
  size_t ilhs;
  ulong uVar6;
  bool bVar7;
  char *sep;
  vector<char,_std::allocator<char>_> matcher_matched;
  vector<char,_std::allocator<char>_> element_matched;
  char *local_78;
  char *local_70;
  ulong local_68;
  _Vector_base<char,_std::allocator<char>_> local_60;
  _Vector_base<char,_std::allocator<char>_> local_48;
  
  __n = *(size_type *)matrix;
  bVar7 = true;
  if (__n != 0 || *(size_type *)(matrix + 8) != 0) {
    if (__n == *(size_type *)(matrix + 8) || *(int *)this != 3) {
      local_60._M_impl.super__Vector_impl_data._M_start._0_1_ = 0;
      std::vector<char,_std::allocator<char>_>::vector
                ((vector<char,_std::allocator<char>_> *)&local_48,__n,(value_type *)&local_60,
                 (allocator_type *)&local_70);
      local_70 = (char *)((ulong)local_70 & 0xffffffffffffff00);
      std::vector<char,_std::allocator<char>_>::vector
                ((vector<char,_std::allocator<char>_> *)&local_60,*(size_type *)(matrix + 8),
                 (value_type *)&local_70,(allocator_type *)&local_78);
      for (uVar6 = 0; uVar6 < *(ulong *)matrix; uVar6 = uVar6 + 1) {
        for (uVar4 = 0; uVar4 < *(ulong *)(matrix + 8); uVar4 = uVar4 + 1) {
          bVar7 = *(char *)(uVar4 + *(ulong *)(matrix + 8) * uVar6 + *(long *)(matrix + 0x10)) ==
                  '\x01';
          *(byte *)((long)local_48._M_impl.super__Vector_impl_data._M_start + uVar6) =
               *(byte *)((long)local_48._M_impl.super__Vector_impl_data._M_start + uVar6) | bVar7;
          pbVar1 = (byte *)(CONCAT71(local_60._M_impl.super__Vector_impl_data._M_start._1_7_,
                                     local_60._M_impl.super__Vector_impl_data._M_start._0_1_) +
                           uVar4);
          *pbVar1 = *pbVar1 | bVar7;
        }
      }
      uVar3 = *(uint *)this;
      bVar7 = true;
      if ((uVar3 & 1) != 0) {
        local_70 = "where the following matchers don\'t match any elements:\n";
        bVar7 = true;
        local_78 = (char *)0x0;
        while( true ) {
          if (local_60._M_impl.super__Vector_impl_data._M_finish +
              -CONCAT71(local_60._M_impl.super__Vector_impl_data._M_start._1_7_,
                        local_60._M_impl.super__Vector_impl_data._M_start._0_1_) <= local_78) break;
          if (local_78[CONCAT71(local_60._M_impl.super__Vector_impl_data._M_start._1_7_,
                                local_60._M_impl.super__Vector_impl_data._M_start._0_1_)] == '\0') {
            if (listener->stream_ == (ostream *)0x0) {
              bVar7 = false;
            }
            else {
              pMVar5 = MatchResultListener::operator<<(listener,&local_70);
              pMVar5 = MatchResultListener::operator<<(pMVar5,(char (*) [10])0x12ee29);
              pMVar5 = MatchResultListener::operator<<(pMVar5,(unsigned_long *)&local_78);
              MatchResultListener::operator<<(pMVar5,(char (*) [3])0x13269a);
              plVar2 = *(long **)(*(long *)(this + 8) + (long)local_78 * 8);
              (**(code **)(*plVar2 + 0x10))(plVar2,listener->stream_);
              local_70 = ",\n";
              bVar7 = false;
            }
          }
          local_78 = local_78 + 1;
        }
        uVar3 = *(uint *)this;
      }
      if ((uVar3 & 2) != 0) {
        local_78 = "\nand ";
        if (bVar7) {
          local_78 = "";
        }
        local_70 = "where the following elements don\'t match any matchers:\n";
        local_68 = 0;
        while( true ) {
          if ((ulong)((long)local_48._M_impl.super__Vector_impl_data._M_finish -
                     (long)local_48._M_impl.super__Vector_impl_data._M_start) <= local_68) break;
          if (*(char *)((long)local_48._M_impl.super__Vector_impl_data._M_start + local_68) == '\0')
          {
            if (listener->stream_ == (ostream *)0x0) {
              bVar7 = false;
            }
            else {
              pMVar5 = MatchResultListener::operator<<(listener,&local_78);
              pMVar5 = MatchResultListener::operator<<(pMVar5,&local_70);
              pMVar5 = MatchResultListener::operator<<(pMVar5,(char (*) [10])0x12ebd8);
              pMVar5 = MatchResultListener::operator<<(pMVar5,&local_68);
              pMVar5 = MatchResultListener::operator<<(pMVar5,(char (*) [3])0x13269a);
              MatchResultListener::operator<<
                        (pMVar5,(element_printouts->
                                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                )._M_impl.super__Vector_impl_data._M_start + local_68);
              local_70 = ",\n";
              local_78 = "";
              bVar7 = false;
            }
          }
          local_68 = local_68 + 1;
        }
      }
      std::_Vector_base<char,_std::allocator<char>_>::~_Vector_base(&local_60);
      std::_Vector_base<char,_std::allocator<char>_>::~_Vector_base(&local_48);
    }
    else {
      if ((__n != 0) && (listener->stream_ != (ostream *)0x0)) {
        pMVar5 = MatchResultListener::operator<<(listener,(char (*) [11])"which has ");
        Elements((UnorderedElementsAreMatcherImplBase *)&local_48,*(size_t *)matrix);
        MatchResultListener::operator<<(pMVar5,(Message *)&local_48);
        if ((long *)local_48._M_impl.super__Vector_impl_data._M_start != (long *)0x0) {
          (**(code **)(*(long *)local_48._M_impl.super__Vector_impl_data._M_start + 8))();
        }
      }
      bVar7 = false;
    }
  }
  return bVar7;
}

Assistant:

bool UnorderedElementsAreMatcherImplBase::VerifyMatchMatrix(
    const ::std::vector<std::string>& element_printouts,
    const MatchMatrix& matrix, MatchResultListener* listener) const {
  if (matrix.LhsSize() == 0 && matrix.RhsSize() == 0) {
    return true;
  }

  if (match_flags() == UnorderedMatcherRequire::ExactMatch) {
    if (matrix.LhsSize() != matrix.RhsSize()) {
      // The element count doesn't match.  If the container is empty,
      // there's no need to explain anything as Google Mock already
      // prints the empty container. Otherwise we just need to show
      // how many elements there actually are.
      if (matrix.LhsSize() != 0 && listener->IsInterested()) {
        *listener << "which has " << Elements(matrix.LhsSize());
      }
      return false;
    }
  }

  bool result = true;
  ::std::vector<char> element_matched(matrix.LhsSize(), 0);
  ::std::vector<char> matcher_matched(matrix.RhsSize(), 0);

  for (size_t ilhs = 0; ilhs < matrix.LhsSize(); ilhs++) {
    for (size_t irhs = 0; irhs < matrix.RhsSize(); irhs++) {
      char matched = matrix.HasEdge(ilhs, irhs);
      element_matched[ilhs] |= matched;
      matcher_matched[irhs] |= matched;
    }
  }

  if (match_flags() & UnorderedMatcherRequire::Superset) {
    const char* sep =
        "where the following matchers don't match any elements:\n";
    for (size_t mi = 0; mi < matcher_matched.size(); ++mi) {
      if (matcher_matched[mi]) continue;
      result = false;
      if (listener->IsInterested()) {
        *listener << sep << "matcher #" << mi << ": ";
        matcher_describers_[mi]->DescribeTo(listener->stream());
        sep = ",\n";
      }
    }
  }

  if (match_flags() & UnorderedMatcherRequire::Subset) {
    const char* sep =
        "where the following elements don't match any matchers:\n";
    const char* outer_sep = "";
    if (!result) {
      outer_sep = "\nand ";
    }
    for (size_t ei = 0; ei < element_matched.size(); ++ei) {
      if (element_matched[ei]) continue;
      result = false;
      if (listener->IsInterested()) {
        *listener << outer_sep << sep << "element #" << ei << ": "
                  << element_printouts[ei];
        sep = ",\n";
        outer_sep = "";
      }
    }
  }
  return result;
}